

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_ltrim(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  undefined8 in_RAX;
  char *zString;
  ushort **ppuVar2;
  long lVar3;
  char *pcVar4;
  jx9_value *pVal;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  int nLen;
  int nListlen;
  undefined8 local_38;
  
  if (nArg < 1) {
    jx9MemObjRelease(pCtx->pRet);
    return 0;
  }
  local_38 = in_RAX;
  zString = jx9_value_to_string(*apArg,(int *)&local_38);
  uVar8 = (ulong)(int)local_38;
  if (0 < (long)uVar8) {
    if (nArg == 1) {
      pcVar5 = zString + uVar8;
      do {
        iVar7 = (int)uVar8;
        cVar1 = *zString;
        local_38._0_4_ = iVar7;
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           ((cVar1 != '\0' &&
            (ppuVar2 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0)))) goto LAB_00131658;
        zString = zString + 1;
        uVar8 = (ulong)(iVar7 - 1U);
      } while (iVar7 - 1U != 0);
      zString = pcVar5;
      local_38._0_4_ = 0;
LAB_00131658:
      pVal = pCtx->pRet;
      goto LAB_0013168c;
    }
    pcVar5 = jx9_value_to_string(apArg[1],(int *)((long)&local_38 + 4));
    if ((long)local_38._4_4_ < 1) {
      pVal = pCtx->pRet;
      goto LAB_0013168c;
    }
    pcVar4 = zString + (int)local_38;
    pcVar6 = zString;
    do {
      zString = pcVar6;
      if (pcVar4 <= pcVar6) break;
      lVar3 = 0;
      do {
        if (zString < pcVar4) {
          zString = zString + (*zString == pcVar5[lVar3]);
        }
        lVar3 = lVar3 + 1;
      } while (local_38._4_4_ != lVar3);
      bVar9 = zString != pcVar6;
      pcVar6 = zString;
    } while (bVar9);
    if (zString < pcVar4) {
      local_38._0_4_ = (int)pcVar4 - (int)zString;
      pVal = pCtx->pRet;
      goto LAB_0013168c;
    }
  }
  pVal = pCtx->pRet;
  zString = "";
  local_38._0_4_ = 0;
LAB_0013168c:
  jx9_value_string(pVal,zString,(int)local_38);
  return 0;
}

Assistant:

static int jx9Builtin_ltrim(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Start the trim process */
	if( nArg < 2 ){
		SyString sStr;
		/* Remove white spaces and NUL byte */
		SyStringInitFromBuf(&sStr, zString, nLen);
		SyStringLeftTrimSafe(&sStr);
		jx9_result_string(pCtx, sStr.zString, (int)sStr.nByte);
	}else{
		/* Char list */
		const char *zList;
		int nListlen;
		zList = jx9_value_to_string(apArg[1], &nListlen);
		if( nListlen < 1 ){
			/* Return the string unchanged */
			jx9_result_string(pCtx, zString, nLen);
		}else{
			const char *zEnd = &zString[nLen];
			const char *zCur = zString;
			const char *zPtr;
			int i;
			/* Left trim */
			for(;;){
				if( zCur >= zEnd ){
					break;
				}
				zPtr = zCur;
				for( i = 0 ; i < nListlen ; i++ ){
					if( zCur < zEnd && zCur[0] == zList[i] ){
						zCur++;
					}
				}
				if( zCur == zPtr ){
					/* No match, break immediately */
					break;
				}
			}
			if( zCur >= zEnd ){
				/* Return the empty string */
				jx9_result_string(pCtx, "", 0);
			}else{
				jx9_result_string(pCtx, zCur, (int)(zEnd-zCur));
			}
		}
	}
	return JX9_OK;
}